

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

void __thiscall glslang::TFunction::dump(TFunction *this,TInfoSink *infoSink,bool complete)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  TType *this_00;
  pointer pcVar3;
  long lVar4;
  TString name;
  TString name_00;
  TString structName;
  TString structName_00;
  char cVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar8;
  undefined4 extraout_var_01;
  undefined7 in_register_00000011;
  char *__end;
  char *s;
  TInfoSinkBase *this_01;
  ulong uVar9;
  long lVar10;
  undefined8 in_stack_fffffffffffffe58;
  TInfoSinkBase *this_02;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  allocator_type in_stack_fffffffffffffe70;
  pointer in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  TString local_148;
  TPoolAllocator *local_120;
  undefined1 *local_118;
  undefined1 local_108 [16];
  TPoolAllocator *local_f8;
  undefined1 *local_f0;
  undefined1 local_e0 [16];
  TString local_d0;
  TPoolAllocator *local_a8;
  undefined1 *local_a0;
  undefined1 local_90 [16];
  TPoolAllocator *local_80;
  undefined1 *local_78;
  undefined1 local_68 [16];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  this_01 = &infoSink->debug;
  iVar6 = (*(this->super_TSymbol)._vptr_TSymbol[3])();
  TInfoSinkBase::append(this_01,*(char **)(CONCAT44(extraout_var,iVar6) + 8));
  TInfoSinkBase::append(this_01,": ");
  if ((int)CONCAT71(in_register_00000011,complete) == 0) {
    TType::getBasicTypeString_abi_cxx11_(&local_d0,&this->returnType);
    TInfoSinkBase::append(this_01,&local_d0);
    TInfoSinkBase::append(this_01," ");
    iVar6 = (*(this->super_TSymbol)._vptr_TSymbol[6])(this);
    TInfoSinkBase::append(this_01,*(char **)(CONCAT44(extraout_var_01,iVar6) + 8));
    TInfoSinkBase::append(this_01,"n");
  }
  else {
    local_80 = GetThreadPoolAllocator();
    local_78 = local_68;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_80,
               "","");
    local_a8 = GetThreadPoolAllocator();
    local_a0 = local_90;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_a8,
               "","");
    name._M_dataplus._M_p = (pointer)&local_a8;
    name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_80;
    name._M_string_length = in_stack_fffffffffffffe58;
    name.field_2._M_allocated_capacity = in_stack_fffffffffffffe60;
    name.field_2._8_8_ = in_stack_fffffffffffffe68;
    structName._M_dataplus._M_p = in_stack_fffffffffffffe78;
    structName._M_dataplus.super_allocator_type.allocator = in_stack_fffffffffffffe70.allocator;
    structName._M_string_length = in_stack_fffffffffffffe80;
    structName.field_2._M_allocated_capacity = in_stack_fffffffffffffe88;
    structName.field_2._8_8_ = in_stack_fffffffffffffe90;
    TType::getCompleteString(&local_d0,&this->returnType,false,true,true,true,name,structName);
    TInfoSinkBase::append(this_01,&local_d0);
    TInfoSinkBase::append(this_01," ");
    iVar6 = (*(this->super_TSymbol)._vptr_TSymbol[3])(this);
    TInfoSinkBase::append(this_01,*(char **)(CONCAT44(extraout_var_00,iVar6) + 8));
    TInfoSinkBase::append(this_01,"(");
    uVar7 = (*(this->super_TSymbol)._vptr_TSymbol[0x24])(this);
    if (0 < (int)uVar7) {
      lVar10 = 8;
      uVar9 = 0;
      this_02 = this_01;
      do {
        pTVar2 = (this->parameters).
                 super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
                 super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = *(TType **)((long)&pTVar2->name + lVar10);
        local_120 = GetThreadPoolAllocator();
        local_118 = local_108;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_120,"","");
        local_f8 = GetThreadPoolAllocator();
        local_f0 = local_e0;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_f8,"","");
        name_00._M_dataplus._M_p = (pointer)&local_f8;
        name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_120;
        name_00._M_string_length = (size_type)this_02;
        name_00.field_2._M_allocated_capacity = (size_type)this;
        name_00.field_2._8_8_ = uVar9;
        structName_00._M_dataplus._M_p = in_stack_fffffffffffffe78;
        structName_00._M_dataplus.super_allocator_type.allocator =
             in_stack_fffffffffffffe70.allocator;
        structName_00._M_string_length = in_stack_fffffffffffffe80;
        structName_00.field_2._M_allocated_capacity = in_stack_fffffffffffffe88;
        structName_00.field_2._8_8_ = in_stack_fffffffffffffe90;
        TType::getCompleteString(&local_d0,this_00,false,true,true,true,name_00,structName_00);
        this_01 = this_02;
        TInfoSinkBase::append(this_02,&local_d0);
        TInfoSinkBase::append(this_02," ");
        cVar5 = (**(code **)(**(long **)((long)&pTVar2->name + lVar10) + 0x128))();
        if (cVar5 == '\0') {
          in_stack_fffffffffffffe70.allocator = GetThreadPoolAllocator();
          in_stack_fffffffffffffe78 = &stack0xfffffffffffffe88;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &stack0xfffffffffffffe70,"","");
        }
        else {
          pbVar8 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   (**(code **)(**(long **)((long)&pTVar2->name + lVar10) + 0x28))();
          std::operator+(&local_58,"of ",pbVar8);
          pbVar8 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   append(&local_58," ");
          in_stack_fffffffffffffe70.allocator = (pbVar8->_M_dataplus).super_allocator_type.allocator
          ;
          in_stack_fffffffffffffe78 = &stack0xfffffffffffffe88;
          pcVar3 = (pbVar8->_M_dataplus)._M_p;
          paVar1 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
               *)pcVar3 == paVar1) {
            in_stack_fffffffffffffe88 = paVar1->_M_allocated_capacity;
            in_stack_fffffffffffffe90 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          }
          else {
            in_stack_fffffffffffffe88 = paVar1->_M_allocated_capacity;
            in_stack_fffffffffffffe78 = pcVar3;
          }
          in_stack_fffffffffffffe80 = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
        }
        s = "";
        TInfoSinkBase::append(this_02,(TString *)&stack0xfffffffffffffe70);
        lVar4 = *(long *)((long)pTVar2 + lVar10 + -8);
        local_148._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        if (lVar4 == 0) {
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_148,"","");
        }
        else {
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&local_148,*(long *)(lVar4 + 8),
                              *(long *)(lVar4 + 0x10) + *(long *)(lVar4 + 8));
        }
        TInfoSinkBase::append(this_02,&local_148);
        if (uVar9 < uVar7 - 1) {
          s = ",";
        }
        TInfoSinkBase::append(this_02,s);
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x18;
        this_02 = this_01;
      } while (uVar7 != uVar9);
    }
    TInfoSinkBase::append(this_01,")");
    TSymbol::dumpExtensions(&this->super_TSymbol,infoSink);
  }
  TInfoSinkBase::append(this_01,"\n");
  return;
}

Assistant:

void TFunction::dump(TInfoSink& infoSink, bool complete) const
{
    if (complete) {
        infoSink.debug << getName().c_str() << ": " << returnType.getCompleteString() << " " << getName().c_str()
                       << "(";

        int numParams = getParamCount();
        for (int i = 0; i < numParams; i++) {
            const TParameter &param = parameters[i];
            infoSink.debug << param.type->getCompleteString() << " "
                           << (param.type->isStruct() ? "of " + param.type->getTypeName() + " " : "")
                           << (param.name ? *param.name : "") << (i < numParams - 1 ? "," : "");
        }

        infoSink.debug << ")";
        dumpExtensions(infoSink);
    } else {
        infoSink.debug << getName().c_str() << ": " << returnType.getBasicTypeString() << " "
                       << getMangledName().c_str() << "n";
    }

    infoSink.debug << "\n";
}